

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void handleSelectionRequest(XEvent *event)

{
  Atom AVar1;
  Display *pDVar2;
  char *pcVar3;
  unsigned_long uVar4;
  Atom AVar5;
  long lVar6;
  Atom AVar7;
  Window WVar8;
  undefined8 uVar9;
  ulong uVar10;
  long *plVar11;
  size_t sVar12;
  undefined4 local_158 [2];
  XEvent reply;
  Atom targets [5];
  Atom local_68;
  Atom formats [3];
  
  AVar7 = 0;
  memset(local_158,0,0xc0);
  plVar11 = (long *)_glfw.x11.clipboardString;
  pDVar2 = _glfw.x11.display;
  formats[0] = _glfw.x11.COMPOUND_STRING;
  formats[1] = 0x1f;
  AVar1 = (event->xselectionrequest).property;
  if (AVar1 == 0) goto LAB_00132194;
  AVar5 = (event->xkey).time;
  if (AVar5 == _glfw.x11.TARGETS) {
    plVar11 = reply.pad + 0x17;
    reply.pad[0x17] = _glfw.x11.TARGETS;
    targets[0] = _glfw.x11.MULTIPLE;
    targets[1] = _glfw.x11.UTF8_STRING;
    targets[2] = _glfw.x11.COMPOUND_STRING;
    targets[3] = 0x1f;
    WVar8 = (event->xkey).root;
    uVar9 = 0x20;
    sVar12 = 5;
    AVar5 = 4;
LAB_0013207a:
    XChangeProperty(pDVar2,WVar8,AVar1,AVar5,uVar9,0,plVar11,sVar12);
  }
  else {
    if (AVar5 != _glfw.x11.MULTIPLE) {
      if (AVar5 != _glfw.x11.SAVE_TARGETS) {
        AVar7 = 0;
        lVar6 = 0;
        do {
          if (AVar5 == formats[lVar6 + -1]) {
            WVar8 = (event->xkey).root;
            sVar12 = strlen(_glfw.x11.clipboardString);
            uVar9 = 8;
            goto LAB_0013207a;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        goto LAB_00132194;
      }
      WVar8 = (event->xkey).root;
      uVar9 = 0x20;
      sVar12 = 0;
      plVar11 = (long *)0x0;
      AVar5 = _glfw.x11.NULL_;
      goto LAB_0013207a;
    }
    uVar4 = _glfwGetWindowPropertyX11
                      ((event->xkey).root,AVar1,_glfw.x11.ATOM_PAIR,(uchar **)(reply.pad + 0x17));
    if (uVar4 != 0) {
      uVar10 = 0;
      do {
        pcVar3 = _glfw.x11.clipboardString;
        pDVar2 = _glfw.x11.display;
        AVar1 = *(Atom *)(reply.pad[0x17] + uVar10 * 8);
        lVar6 = 0;
        do {
          if (AVar1 == formats[lVar6 + -1]) {
            WVar8 = (event->xkey).root;
            uVar9 = *(undefined8 *)(reply.pad[0x17] + 8 + uVar10 * 8);
            sVar12 = strlen(_glfw.x11.clipboardString);
            XChangeProperty(pDVar2,WVar8,uVar9,AVar1,8,0,pcVar3,sVar12);
            goto LAB_0013213c;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        *(undefined8 *)(reply.pad[0x17] + 8 + uVar10 * 8) = 0;
LAB_0013213c:
        uVar10 = uVar10 + 2;
      } while (uVar10 < uVar4);
    }
    XChangeProperty(_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                    _glfw.x11.ATOM_PAIR,0x20,0,reply.pad[0x17],uVar4);
    XFree(reply.pad[0x17]);
  }
  AVar7 = (event->xselectionrequest).property;
LAB_00132194:
  local_158[0] = 0x1f;
  reply.xerror.resourceid = (XID)(event->xany).display;
  reply.xany.display = (Display *)(event->xkey).root;
  reply.xany.window = (event->xkey).subwindow;
  reply.xkey.root = (event->xkey).time;
  reply.xkey.time = (event->xconfigure).above;
  reply.xkey.subwindow = AVar7;
  XSendEvent(_glfw.x11.display,reply.xany.display,0,0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply;
    memset(&reply, 0, sizeof(reply));

    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.type = SelectionNotify;
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}